

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseReservedNames
          (Parser *this,EnumDescriptorProto *message,LocationRecorder *parent_location)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output;
  LocationRecorder location;
  LocationRecorder LStack_48;
  
  do {
    LocationRecorder::LocationRecorder
              (&LStack_48,parent_location,
               (message->reserved_name_).super_RepeatedPtrFieldBase.current_size_);
    output = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::Add(&message->reserved_name_);
    bVar1 = ConsumeString(this,output,"Expected enum value.");
    LocationRecorder::~LocationRecorder(&LStack_48);
    if (!bVar1) {
      return false;
    }
    bVar1 = TryConsume(this,",");
  } while (bVar1);
  bVar1 = ConsumeEndOfDeclaration(this,";",parent_location);
  return bVar1;
}

Assistant:

bool Parser::ParseReservedNames(EnumDescriptorProto* message,
                                const LocationRecorder& parent_location) {
  do {
    LocationRecorder location(parent_location, message->reserved_name_size());
    DO(ConsumeString(message->add_reserved_name(), "Expected enum value."));
  } while (TryConsume(","));
  DO(ConsumeEndOfDeclaration(";", &parent_location));
  return true;
}